

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O3

void __thiscall
bson_stream_encoder_reset_test_fixture::bson_stream_encoder_reset_test_fixture
          (bson_stream_encoder_reset_test_fixture *this)

{
  pointer __s;
  value_type_conflict *__val;
  pointer puVar1;
  binary_stream_sink local_50;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->output2);
  local_50.stream_ptr_ = (basic_ostream<char,_std::char_traits<char>_> *)this;
  __s = (pointer)operator_new(0x4000);
  puVar1 = __s + 0x4000;
  memset(__s,0,0x4000);
  (this->encoder).super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_bson_encoder_00b30dd8;
  (this->encoder).sink_.stream_ptr_ = (basic_ostream<char,_std::char_traits<char>_> *)this;
  (this->encoder).sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  (this->encoder).sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->encoder).sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
  local_50.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encoder).sink_.p_ = __s;
  (this->encoder).sink_.begin_buffer_ = __s;
  (this->encoder).sink_.end_buffer_ = puVar1;
  *(undefined4 *)&(this->encoder).options_.field_0x10 = 0x400;
  (this->encoder).options_._vptr_bson_encode_options = (_func_int **)0xb2fe70;
  *(undefined8 *)&(this->encoder).options_.field_0x8 = 0xb2fe98;
  (this->encoder).stack_.
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->encoder).stack_.
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->encoder).stack_.
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encoder).buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->encoder).buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->encoder).buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encoder).nesting_depth_ = 0;
  local_50.begin_buffer_ = __s;
  local_50.end_buffer_ = puVar1;
  local_50.p_ = __s;
  ::jsoncons::binary_stream_sink::~binary_stream_sink(&local_50);
  return;
}

Assistant:

bson_stream_encoder_reset_test_fixture() : encoder(output1) {}